

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O1

XSWildcard * __thiscall
xercesc_4_0::XSObjectFactory::createXSWildcard
          (XSObjectFactory *this,ContentSpecNode *rootNode,XSModel *xsModel)

{
  BaseRefVectorOf<xercesc_4_0::XSObject> *this_00;
  XMLSize_t XVar1;
  XSWildcard *this_01;
  XSAnnotation *annot;
  
  this_01 = (XSWildcard *)XMemory::operator_new(0x40,this->fMemoryManager);
  annot = getAnnotationFromModel(this,xsModel,rootNode);
  XSWildcard::XSWildcard(this_01,rootNode,annot,xsModel,this->fMemoryManager);
  this_00 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
  BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(this_00,1);
  XVar1 = this_00->fCurCount;
  this_00->fElemList[XVar1] = (XSObject *)this_01;
  this_00->fCurCount = XVar1 + 1;
  return this_01;
}

Assistant:

XSWildcard*
XSObjectFactory::createXSWildcard(const ContentSpecNode* const rootNode,
                                  XSModel* const xsModel)
{
    XSWildcard* xsWildcard = new (fMemoryManager) XSWildcard
    (
        rootNode
        , getAnnotationFromModel(xsModel, rootNode)
        , xsModel
        , fMemoryManager
    );
    fDeleteVector->addElement(xsWildcard);

    return xsWildcard;
}